

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_blurshader.cpp
# Opt level: O1

void __thiscall
FBlurShader::ComputeBlurSamples
          (FBlurShader *this,int sampleCount,float blurAmount,TArray<float,_float> *sampleWeights,
          TArray<int,_int> *sampleOffsets)

{
  ulong uVar1;
  float *pfVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 in_XMM3 [16];
  undefined1 auVar11 [16];
  
  TArray<float,_float>::Resize(sampleWeights,sampleCount);
  TArray<int,_int>::Resize(sampleOffsets,sampleCount);
  fVar6 = blurAmount * 6.2831855;
  auVar11 = rsqrtss(in_XMM3,ZEXT416((uint)fVar6));
  fVar9 = auVar11._0_4_;
  fVar8 = fVar6 * fVar9 * fVar9 + -3.0;
  fVar10 = fVar9 * -0.5 * fVar8;
  pfVar2 = sampleWeights->Array;
  *pfVar2 = fVar10;
  piVar3 = sampleOffsets->Array;
  *piVar3 = 0;
  if (1 < sampleCount) {
    iVar5 = -1;
    uVar4 = 0;
    do {
      fVar7 = (float)(int)uVar4 + 1.0;
      fVar7 = expf(fVar7 * fVar7 * -0.5 * (1.0 / (blurAmount * blurAmount)));
      fVar7 = fVar7 * (1.0 / (float)(~-(uint)(ABS(fVar6) < 1.1754944e-38) &
                                    (uint)(fVar6 * fVar9 * -0.5 * fVar8)));
      pfVar2[uVar4 * 2 + 1] = fVar7;
      pfVar2[uVar4 * 2 + 2] = fVar7;
      uVar1 = uVar4 + 1;
      piVar3[uVar4 * 2 + 1] = (int)uVar1;
      piVar3[uVar4 * 2 + 2] = iVar5;
      fVar10 = fVar10 + fVar7 + fVar7;
      iVar5 = iVar5 + -1;
      uVar4 = uVar1;
    } while ((uint)sampleCount >> 1 != uVar1);
  }
  if (0 < sampleCount) {
    uVar4 = 0;
    do {
      pfVar2[uVar4] = pfVar2[uVar4] * (1.0 / fVar10);
      uVar4 = uVar4 + 1;
    } while ((uint)sampleCount != uVar4);
  }
  return;
}

Assistant:

void FBlurShader::ComputeBlurSamples(int sampleCount, float blurAmount, TArray<float> &sampleWeights, TArray<int> &sampleOffsets)
{
	sampleWeights.Resize(sampleCount);
	sampleOffsets.Resize(sampleCount);

	sampleWeights[0] = ComputeGaussian(0, blurAmount);
	sampleOffsets[0] = 0;

	float totalWeights = sampleWeights[0];

	for (int i = 0; i < sampleCount / 2; i++)
	{
		float weight = ComputeGaussian(i + 1.0f, blurAmount);

		sampleWeights[i * 2 + 1] = weight;
		sampleWeights[i * 2 + 2] = weight;
		sampleOffsets[i * 2 + 1] = i + 1;
		sampleOffsets[i * 2 + 2] = -i - 1;

		totalWeights += weight * 2;
	}

	for (int i = 0; i < sampleCount; i++)
	{
		sampleWeights[i] /= totalWeights;
	}
}